

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void Update_Chan_Algo5(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((CH->SLOT[2].Ecnt == 0x20000000) && (CH->SLOT[1].Ecnt == 0x20000000)) {
    if (CH->SLOT[3].Ecnt == 0x20000000 || length == 0) {
      return;
    }
  }
  else if (length == 0) {
    return;
  }
  uVar8 = 0;
  do {
    iVar4 = CH->SLOT[0].Fcnt;
    YM2612->in0 = iVar4;
    iVar6 = CH->SLOT[2].Fcnt;
    YM2612->in1 = iVar6;
    iVar1 = CH->SLOT[1].Fcnt;
    YM2612->in2 = iVar1;
    iVar2 = CH->SLOT[3].Fcnt;
    YM2612->in3 = iVar2;
    CH->SLOT[0].Fcnt = iVar4 + CH->SLOT[0].Finc;
    CH->SLOT[2].Fcnt = iVar6 + CH->SLOT[2].Finc;
    CH->SLOT[1].Fcnt = iVar1 + CH->SLOT[1].Finc;
    CH->SLOT[3].Fcnt = iVar2 + CH->SLOT[3].Finc;
    if ((CH->SLOT[0].SEG & 4) == 0) {
      YM2612->en0 = CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
      YM2612->en0 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en0 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en0 = 0;
      }
    }
    if ((CH->SLOT[2].SEG & 4) == 0) {
      uVar3 = ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)] + CH->SLOT[2].TLL;
LAB_00135132:
      YM2612->en1 = uVar3;
    }
    else {
      uVar3 = ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)] + CH->SLOT[2].TLL;
      YM2612->en1 = uVar3;
      if ((int)uVar3 < 0x1000) {
        uVar3 = uVar3 ^ 0xfff;
        goto LAB_00135132;
      }
      YM2612->en1 = 0;
    }
    if ((CH->SLOT[1].SEG & 4) == 0) {
      YM2612->en2 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      YM2612->en2 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en2 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en2 = 0;
      }
    }
    if ((CH->SLOT[3].SEG & 4) == 0) {
      YM2612->en3 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      YM2612->en3 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en3 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en3 = 0;
      }
    }
    iVar4 = CH->SLOT[0].Ecnt + CH->SLOT[0].Einc;
    CH->SLOT[0].Ecnt = iVar4;
    if (CH->SLOT[0].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
    }
    iVar4 = CH->SLOT[2].Ecnt + CH->SLOT[2].Einc;
    CH->SLOT[2].Ecnt = iVar4;
    if (CH->SLOT[2].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
    }
    iVar4 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
    CH->SLOT[1].Ecnt = iVar4;
    if (CH->SLOT[1].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
    }
    iVar4 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
    CH->SLOT[3].Ecnt = iVar4;
    if (CH->SLOT[3].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
    }
    YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
    iVar4 = CH->S0_OUT[0];
    CH->S0_OUT[1] = iVar4;
    CH->S0_OUT[0] =
         *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                 (long)YM2612->en0 * 4);
    uVar3 = iVar4 + YM2612->in1;
    YM2612->in1 = uVar3;
    uVar5 = YM2612->in2 + CH->S0_OUT[1];
    YM2612->in2 = uVar5;
    uVar7 = YM2612->in3 + CH->S0_OUT[1];
    YM2612->in3 = uVar7;
    iVar4 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar3 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en1 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar7 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en3 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar5 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en2 * 4) >> 0xf;
    CH->OUTd = iVar4;
    iVar6 = 0x2fff;
    if ((0x2fff < iVar4) || (iVar6 = -0x2fff, iVar4 < -0x2fff)) {
      CH->OUTd = iVar6;
    }
    (*buf)[uVar8] = (*buf)[uVar8] + (CH->LEFT & CH->OUTd);
    buf[1][uVar8] = buf[1][uVar8] + (CH->RIGHT & CH->OUTd);
    uVar8 = uVar8 + 1;
    if (length + (length == 0) == uVar8) {
      return;
    }
  } while( true );
}

Assistant:

static void Update_Chan_Algo5(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;

  if ((CH->SLOT[S1].Ecnt == ENV_END) && (CH->SLOT[S2].Ecnt == ENV_END) && (CH->SLOT[S3].Ecnt == ENV_END))
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 5 len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE
    GET_CURRENT_ENV
    UPDATE_ENV
    DO_ALGO_5
    DO_OUTPUT
  }
}